

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_OptimizedTree.cpp
# Opt level: O3

void __thiscall Opcode::AABBCollisionTree::~AABBCollisionTree(AABBCollisionTree *this)

{
  AABBCollisionNode *pAVar1;
  
  (this->super_AABBOptimizedTree)._vptr_AABBOptimizedTree =
       (_func_int **)&PTR__AABBCollisionTree_0024e398;
  pAVar1 = this->mNodes;
  if (pAVar1 != (AABBCollisionNode *)0x0) {
    operator_delete__(&pAVar1[-1].mData,pAVar1[-1].mData << 5 | 8);
  }
  operator_delete(this,0x18);
  return;
}

Assistant:

AABBCollisionTree::~AABBCollisionTree()
{
	DELETEARRAY(mNodes);
}